

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::SizeIsMatcher<int>::
Impl<const_google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>_&>::
MatchAndExplain(Impl<const_google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>_&>
                *this,RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *container,
               MatchResultListener *listener)

{
  bool bVar1;
  MatchResultListener *pMVar2;
  SizeType size;
  StringMatchResultListener size_listener;
  int local_1dc;
  string local_1d8;
  StringMatchResultListener local_1b8;
  
  local_1dc = (container->super_RepeatedPtrFieldBase).current_size_;
  StringMatchResultListener::StringMatchResultListener(&local_1b8);
  bVar1 = MatcherBase<int>::MatchAndExplain
                    (&(this->size_matcher_).super_MatcherBase<int>,&local_1dc,
                     &local_1b8.super_MatchResultListener);
  pMVar2 = MatchResultListener::operator<<(listener,(char (*) [12])"whose size ");
  pMVar2 = MatchResultListener::operator<<(pMVar2,&local_1dc);
  local_1d8._M_dataplus._M_p = " doesn\'t match";
  if (bVar1) {
    local_1d8._M_dataplus._M_p = " matches";
  }
  MatchResultListener::operator<<(pMVar2,(char **)&local_1d8);
  std::__cxx11::stringbuf::str();
  PrintIfNotEmpty(&local_1d8,listener->stream_);
  std::__cxx11::string::~string((string *)&local_1d8);
  StringMatchResultListener::~StringMatchResultListener(&local_1b8);
  return bVar1;
}

Assistant:

bool MatchAndExplain(Container container,
                         MatchResultListener* listener) const override {
      SizeType size = container.size();
      StringMatchResultListener size_listener;
      const bool result = size_matcher_.MatchAndExplain(size, &size_listener);
      *listener << "whose size " << size
                << (result ? " matches" : " doesn't match");
      PrintIfNotEmpty(size_listener.str(), listener->stream());
      return result;
    }